

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

void __thiscall re2::Regexp::Destroy(Regexp *this)

{
  Regexp *this_00;
  bool bVar1;
  ushort uVar2;
  uint16_t uVar3;
  ostream *this_01;
  Regexp *pRVar4;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  int i;
  ulong uVar6;
  LogMessage local_1b0;
  
  bVar1 = QuickDestroy(this);
  if (!bVar1) {
    this->down_ = (Regexp *)0x0;
    while (this != (Regexp *)0x0) {
      pRVar4 = this->down_;
      if (this->ref_ != 0) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/regexp.cc"
                   ,0x92);
        this_01 = std::operator<<((ostream *)&local_1b0.str_,"Bad reference count ");
        std::ostream::operator<<(this_01,this->ref_);
        LogMessage::~LogMessage(&local_1b0);
      }
      uVar2 = this->nsub_;
      if (uVar2 != 0) {
        if (uVar2 == 1) {
          paVar5 = &this->field_5;
        }
        else {
          paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
        }
        for (uVar6 = 0; uVar6 < uVar2; uVar6 = uVar6 + 1) {
          this_00 = paVar5[uVar6].subone_;
          if (this_00 != (Regexp *)0x0) {
            if (this_00->ref_ == 0xffff) {
              Decref(this_00);
              uVar3 = this_00->ref_;
            }
            else {
              uVar3 = this_00->ref_ - 1;
              this_00->ref_ = uVar3;
            }
            if ((uVar3 == 0) && (bVar1 = QuickDestroy(this_00), !bVar1)) {
              this_00->down_ = pRVar4;
              pRVar4 = this_00;
            }
          }
          uVar2 = this->nsub_;
        }
        if (paVar5 != (anon_union_8_2_3df47e5c_for_Regexp_7 *)0x0 && 1 < uVar2) {
          operator_delete__(paVar5);
        }
        this->nsub_ = 0;
      }
      ~Regexp(this);
      operator_delete(this);
      this = pRVar4;
    }
  }
  return;
}

Assistant:

void Regexp::Destroy() {
  if (QuickDestroy())
    return;

  // Handle recursive Destroy with explicit stack
  // to avoid arbitrarily deep recursion on process stack [sigh].
  down_ = NULL;
  Regexp* stack = this;
  while (stack != NULL) {
    Regexp* re = stack;
    stack = re->down_;
    if (re->ref_ != 0)
      LOG(DFATAL) << "Bad reference count " << re->ref_;
    if (re->nsub_ > 0) {
      Regexp** subs = re->sub();
      for (int i = 0; i < re->nsub_; i++) {
        Regexp* sub = subs[i];
        if (sub == NULL)
          continue;
        if (sub->ref_ == kMaxRef)
          sub->Decref();
        else
          --sub->ref_;
        if (sub->ref_ == 0 && !sub->QuickDestroy()) {
          sub->down_ = stack;
          stack = sub;
        }
      }
      if (re->nsub_ > 1)
        delete[] subs;
      re->nsub_ = 0;
    }
    delete re;
  }
}